

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall crnlib::crn_comp::alias_images(crn_comp *this)

{
  uint uVar1;
  crn_uint32 cVar2;
  uint uVar3;
  uint uVar4;
  conversion_type conv_type_00;
  level_details *plVar5;
  sbyte sVar6;
  uint local_78;
  uint blockHeight;
  uint level;
  undefined1 local_68 [8];
  image_u8 cooked_image;
  uint local_30;
  uint level_index_1;
  uint face_index_1;
  conversion_type conv_type;
  uint height;
  uint width;
  uint level_index;
  uint face_index;
  crn_comp *this_local;
  
  width = 0;
  do {
    if (this->m_pParams->m_faces <= width) {
      conv_type_00 = image_utils::get_image_conversion_type_from_crn_format
                               (this->m_pParams->m_format);
      if (conv_type_00 != cConversion_Invalid) {
        for (local_30 = 0; local_30 < this->m_pParams->m_faces; local_30 = local_30 + 1) {
          for (cooked_image.m_pixel_buf.m_capacity = 0;
              cooked_image.m_pixel_buf.m_capacity < this->m_pParams->m_levels;
              cooked_image.m_pixel_buf.m_capacity = cooked_image.m_pixel_buf.m_capacity + 1) {
            image<crnlib::color_quad<unsigned_char,_int>_>::image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_68,
                       this->m_images[local_30] + cooked_image.m_pixel_buf.m_capacity);
            image_utils::convert_image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_68,conv_type_00);
            image<crnlib::color_quad<unsigned_char,_int>_>::swap
                      (this->m_images[local_30] + cooked_image.m_pixel_buf.m_capacity,
                       (image<crnlib::color_quad<unsigned_char,_int>_> *)local_68);
            image<crnlib::color_quad<unsigned_char,_int>_>::~image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_68);
          }
        }
      }
      vector<crnlib::crn_comp::level_details>::resize
                (&this->m_levels,this->m_pParams->m_levels,false);
      this->m_total_blocks = 0;
      for (local_78 = 0; local_78 < this->m_pParams->m_levels; local_78 = local_78 + 1) {
        uVar3 = math::maximum<unsigned_int>(1,this->m_pParams->m_height >> ((byte)local_78 & 0x1f));
        uVar4 = math::maximum<unsigned_int>(1,this->m_pParams->m_width >> ((byte)local_78 & 0x1f));
        sVar6 = 2;
        if ((this->m_has_subblocks & 1U) != 0) {
          sVar6 = 1;
        }
        plVar5 = vector<crnlib::crn_comp::level_details>::operator[](&this->m_levels,local_78);
        plVar5->block_width = (uVar4 + 7 & 0xfffffff8) >> sVar6;
        uVar1 = this->m_total_blocks;
        plVar5 = vector<crnlib::crn_comp::level_details>::operator[](&this->m_levels,local_78);
        plVar5->first_block = uVar1;
        cVar2 = this->m_pParams->m_faces;
        plVar5 = vector<crnlib::crn_comp::level_details>::operator[](&this->m_levels,local_78);
        uVar1 = plVar5->block_width;
        plVar5 = vector<crnlib::crn_comp::level_details>::operator[](&this->m_levels,local_78);
        plVar5->num_blocks = cVar2 * uVar1 * ((uVar3 + 7 & 0xfffffff8) >> 2);
        plVar5 = vector<crnlib::crn_comp::level_details>::operator[](&this->m_levels,local_78);
        this->m_total_blocks = plVar5->num_blocks + this->m_total_blocks;
      }
      return true;
    }
    for (height = 0; height < this->m_pParams->m_levels; height = height + 1) {
      uVar3 = math::maximum<unsigned_int>(1,this->m_pParams->m_width >> ((byte)height & 0x1f));
      uVar4 = math::maximum<unsigned_int>(1,this->m_pParams->m_height >> ((byte)height & 0x1f));
      if (this->m_pParams->m_pImages[width][height] == (crn_uint32 *)0x0) {
        return false;
      }
      image<crnlib::color_quad<unsigned_char,_int>_>::alias
                (this->m_images[width] + height,
                 (color_quad<unsigned_char,_int> *)this->m_pParams->m_pImages[width][height],uVar3,
                 uVar4,0xffffffff,0xf);
    }
    width = width + 1;
  } while( true );
}

Assistant:

bool crn_comp::alias_images()
    {
        for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
        {
            for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
            {
                const uint width = math::maximum(1U, m_pParams->m_width >> level_index);
                const uint height = math::maximum(1U, m_pParams->m_height >> level_index);
                if (!m_pParams->m_pImages[face_index][level_index])
                {
                    return false;
                }
                m_images[face_index][level_index].alias((color_quad_u8*)m_pParams->m_pImages[face_index][level_index], width, height);
            }
        }

        image_utils::conversion_type conv_type = image_utils::get_image_conversion_type_from_crn_format((crn_format)m_pParams->m_format);
        if (conv_type != image_utils::cConversion_Invalid)
        {
            for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
            {
                for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
                {
                    image_u8 cooked_image(m_images[face_index][level_index]);
                    image_utils::convert_image(cooked_image, conv_type);
                    m_images[face_index][level_index].swap(cooked_image);
                }
            }
        }

        m_levels.resize(m_pParams->m_levels);
        m_total_blocks = 0;
        for (uint level = 0; level < m_pParams->m_levels; level++)
        {
            uint blockHeight = ((math::maximum(1U, m_pParams->m_height >> level) + 7) & ~7) >> 2;
            m_levels[level].block_width = ((math::maximum(1U, m_pParams->m_width >> level) + 7) & ~7) >> (m_has_subblocks ? 1 : 2);
            m_levels[level].first_block = m_total_blocks;
            m_levels[level].num_blocks = m_pParams->m_faces * m_levels[level].block_width * blockHeight;
            m_total_blocks += m_levels[level].num_blocks;
        }

        return true;
    }